

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathLangFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlChar *pxVar1;
  int iVar2;
  int iVar3;
  xmlXPathObjectPtr pxVar4;
  xmlChar *pxVar5;
  int local_38;
  int local_34;
  int i;
  int ret;
  xmlChar *lang;
  xmlChar *theLang;
  xmlXPathObjectPtr val;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  local_34 = 0;
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < ctxt->valueFrame + 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING)) {
          xmlXPathErr(ctxt,0xb);
        }
        else {
          pxVar4 = valuePop(ctxt);
          pxVar1 = pxVar4->stringval;
          pxVar5 = xmlNodeGetLang(ctxt->context->node);
          if ((pxVar5 != (xmlChar *)0x0) && (pxVar1 != (xmlChar *)0x0)) {
            for (local_38 = 0; pxVar1[local_38] != '\0'; local_38 = local_38 + 1) {
              iVar2 = toupper((uint)pxVar1[local_38]);
              iVar3 = toupper((uint)pxVar5[local_38]);
              if (iVar2 != iVar3) goto LAB_0025416a;
            }
            if ((pxVar5[local_38] == '\0') || (pxVar5[local_38] == '-')) {
              local_34 = 1;
            }
          }
LAB_0025416a:
          if (pxVar5 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar5);
          }
          xmlXPathReleaseObject(ctxt->context,pxVar4);
          pxVar4 = xmlXPathCacheNewBoolean(ctxt->context,local_34);
          valuePush(ctxt,pxVar4);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathLangFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr val = NULL;
    const xmlChar *theLang = NULL;
    const xmlChar *lang;
    int ret = 0;
    int i;

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    val = valuePop(ctxt);
    lang = val->stringval;
    theLang = xmlNodeGetLang(ctxt->context->node);
    if ((theLang != NULL) && (lang != NULL)) {
        for (i = 0;lang[i] != 0;i++)
	    if (toupper(lang[i]) != toupper(theLang[i]))
	        goto not_equal;
	if ((theLang[i] == 0) || (theLang[i] == '-'))
	    ret = 1;
    }
not_equal:
    if (theLang != NULL)
	xmlFree((void *)theLang);

    xmlXPathReleaseObject(ctxt->context, val);
    valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt->context, ret));
}